

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

UnicodeString * icu_63::appendAsciiDigits(int32_t number,uint8_t length,UnicodeString *str)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  int32_t digits [10];
  undefined4 uStack_50;
  UChar local_4a;
  int aiStack_48 [12];
  
  uVar2 = (ulong)(uint)-number;
  if (0 < number) {
    uVar2 = (ulong)(uint)number;
  }
  if ((int)CONCAT71(in_register_00000031,length) == 0) {
    uVar4 = 0;
    do {
      uVar1 = (uint)uVar2;
      aiStack_48[uVar4] = uVar1 + (int)(uVar2 / 10) * -10;
      uVar4 = uVar4 + 1;
      uVar2 = uVar2 / 10;
    } while (9 < uVar1);
  }
  else {
    uVar4 = CONCAT71(in_register_00000031,length) & 0xffffffff;
    uVar3 = 0;
    do {
      aiStack_48[uVar3] = (int)uVar2 + (int)(uVar2 / 10) * -10;
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 / 10;
    } while (length != uVar3);
  }
  if (number < 0) {
    local_4a = L'-';
    UnicodeString::doAppend(str,&local_4a,0,1);
  }
  if ((char)uVar4 != '\0') {
    uVar2 = (uVar4 & 0xff) + 1;
    do {
      local_4a = (short)(&uStack_50)[uVar2] + L'0';
      UnicodeString::doAppend(str,&local_4a,0,1);
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return str;
}

Assistant:

static UnicodeString& appendAsciiDigits(int32_t number, uint8_t length, UnicodeString& str) {
    UBool negative = FALSE;
    int32_t digits[10]; // max int32_t is 10 decimal digits
    int32_t i;

    if (number < 0) {
        negative = TRUE;
        number *= -1;
    }

    length = length > 10 ? 10 : length;
    if (length == 0) {
        // variable length
        i = 0;
        do {
            digits[i++] = number % 10;
            number /= 10;
        } while (number != 0);
        length = static_cast<uint8_t>(i);
    } else {
        // fixed digits
        for (i = 0; i < length; i++) {
           digits[i] = number % 10;
           number /= 10;
        }
    }
    if (negative) {
        str.append(MINUS);
    }
    for (i = length - 1; i >= 0; i--) {
        str.append((UChar)(digits[i] + 0x0030));
    }
    return str;
}